

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::Generate
          (MessageBuilderGenerator *this,Printer *printer)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_00;
  Descriptor *descriptor;
  OneofDescriptor *oneof;
  MessageBuilderGenerator *pMVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  ImmutableFieldGenerator *pIVar6;
  Descriptor *descriptor_00;
  Descriptor *descriptor_01;
  AlphaNum *a;
  ulong uVar7;
  ulong extraout_RDX;
  int iVar8;
  int i;
  long lVar9;
  int i_1;
  long lVar10;
  java *this_01;
  allocator local_e1;
  MessageBuilderGenerator *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  AlphaNum local_88;
  _Rb_tree_node_base *local_58;
  key_type local_50;
  
  WriteMessageDocComment(printer,this->descriptor_);
  descriptor = this->descriptor_;
  if (*(int *)(descriptor + 0x78) < 1) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&vars,this->name_resolver_,descriptor);
    ExtraBuilderInterfaces_abi_cxx11_((string *)&local_88,(java *)this->descriptor_,descriptor_01);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    io::Printer::
    Print<char[10],std::__cxx11::string,char[17],std::__cxx11::string,char[4],std::__cxx11::string>
              (printer,
               "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
               ,(char (*) [10])0x3dd2a7,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
               (char (*) [17])"extra_interfaces",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               (char (*) [4])0x3cdf4b,&local_d8);
  }
  else {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&vars,this->name_resolver_,descriptor);
    ExtraBuilderInterfaces_abi_cxx11_((string *)&local_88,(java *)this->descriptor_,descriptor_00);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    io::Printer::
    Print<char[10],std::__cxx11::string,char[17],std::__cxx11::string,char[4],std::__cxx11::string>
              (printer,
               "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n      $classname$, Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
               ,(char (*) [10])0x3dd2a7,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
               (char (*) [17])"extra_interfaces",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               (char (*) [4])0x3cdf4b,&local_d8);
  }
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&vars);
  io::Printer::Indent(printer);
  GenerateDescriptorMethods(this,printer);
  GenerateCommonBuilderMethods(this,printer);
  bVar2 = Context::HasGeneratedMethods(this->context_,this->descriptor_);
  if (bVar2) {
    GenerateIsInitialized(this,printer);
    GenerateBuilderParsingMethods(this,printer);
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58 = &(this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_e0 = this;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var5 = (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pMVar1 = local_e0, p_Var5 != local_58; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    oneof = *(OneofDescriptor **)(p_Var5 + 1);
    Context::GetOneofGeneratorInfo(local_e0->context_,oneof);
    std::__cxx11::string::string((string *)&local_88,"oneof_name",(allocator *)&local_d8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_88);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&local_88);
    Context::GetOneofGeneratorInfo(local_e0->context_,oneof);
    std::__cxx11::string::string
              ((string *)&local_88,"oneof_capitalized_name",(allocator *)&local_d8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_88);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&local_88);
    strings::AlphaNum::AlphaNum
              (&local_88,(int)(((long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x30)) / 0x28));
    StrCat_abi_cxx11_(&local_d8,(protobuf *)&local_88,a);
    std::__cxx11::string::string((string *)&local_50,"oneof_index",&local_e1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_50);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_d8);
    io::Printer::Print(printer,&vars,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(printer,&vars,
                       "public $oneof_capitalized_name$Case\n    get$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\npublic Builder clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n"
                      );
    io::Printer::Print<>(printer,"  onChanged();\n");
    io::Printer::Print<>(printer,"  return this;\n}\n\n");
  }
  this_00 = &local_e0->field_generators_;
  lVar10 = 0;
  iVar8 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(pMVar1->descriptor_ + 4); lVar9 = lVar9 + 1) {
    pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (this_00,(FieldDescriptor *)(*(long *)(pMVar1->descriptor_ + 0x28) + lVar10))
    ;
    iVar3 = (*pIVar6->_vptr_ImmutableFieldGenerator[3])(pIVar6);
    iVar8 = iVar8 + iVar3;
    lVar10 = lVar10 + 0x48;
  }
  iVar3 = (iVar8 + 0x1f) / 0x20;
  uVar7 = (long)(iVar8 + 0x1f) % 0x20 & 0xffffffff;
  this_01 = (java *)0x0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != (int)this_01; this_01 = (java *)(ulong)((int)this_01 + 1)) {
    GetBitFieldName_abi_cxx11_((string *)&local_88,this_01,(int)uVar7);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,"private int $bit_field_name$;\n",(char (*) [15])"bit_field_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    uVar7 = extraout_RDX;
  }
  lVar9 = 0;
  for (lVar10 = 0; lVar10 < *(int *)(local_e0->descriptor_ + 4); lVar10 = lVar10 + 1) {
    io::Printer::Print<>(printer,"\n");
    pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (this_00,(FieldDescriptor *)(*(long *)(local_e0->descriptor_ + 0x28) + lVar9)
                       );
    (*pIVar6->_vptr_ImmutableFieldGenerator[6])(pIVar6,printer);
    lVar9 = lVar9 + 0x48;
  }
  io::Printer::Print<>
            (printer,
             "@java.lang.Override\npublic final Builder setUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.setUnknownFields(unknownFields);\n}\n\n@java.lang.Override\npublic final Builder mergeUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.mergeUnknownFields(unknownFields);\n}\n\n"
            );
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n",
             (char (*) [10])0x3e7d3e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(local_e0->descriptor_ + 8) + 0x20));
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageBuilderGenerator::Generate(io::Printer* printer) {
  WriteMessageDocComment(printer, descriptor_);
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n"
        "      $classname$, Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "extra_interfaces", ExtraBuilderInterfaces(descriptor_), "ver",
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> "
        "implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "extra_interfaces", ExtraBuilderInterfaces(descriptor_), "ver",
        GeneratedCodeVersionSuffix());
  }
  printer->Indent();

  GenerateDescriptorMethods(printer);
  GenerateCommonBuilderMethods(printer);

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateBuilderParsingMethods(printer);
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (auto oneof : oneofs_) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat(oneof->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // oneofCase() and clearOneof()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "    get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n"
                   "public Builder clear$oneof_capitalized_name$() {\n"
                   "  $oneof_name$Case_ = 0;\n"
                   "  $oneof_name$_ = null;\n");
    printer->Print("  onChanged();\n");
    printer->Print(
        "  return this;\n"
        "}\n"
        "\n");
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForBuilder();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderMembers(printer);
  }

  // Override methods declared in GeneratedMessage to return the concrete
  // generated type so callsites won't depend on GeneratedMessage. This
  // is needed to keep binary compatibility when we change generated code
  // to subclass a different GeneratedMessage class (e.g., in v3.0.0 release
  // we changed all generated code to subclass GeneratedMessageV3).
  printer->Print(
      "@java.lang.Override\n"
      "public final Builder setUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.setUnknownFields(unknownFields);\n"
      "}\n"
      "\n"
      "@java.lang.Override\n"
      "public final Builder mergeUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.mergeUnknownFields(unknownFields);\n"
      "}\n"
      "\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}